

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCurl.cxx
# Opt level: O0

string * cmCurlSetNETRCOption
                   (string *__return_storage_ptr__,CURL *curl,string *netrc_level,string *netrc_file
                   )

{
  bool bVar1;
  char cVar2;
  CURLcode CVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *pcVar6;
  uint local_30;
  CURLcode res;
  CURL_NETRC_OPTION curl_netrc_level;
  string *netrc_file_local;
  string *netrc_level_local;
  CURL *curl_local;
  string *e;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_30 = 3;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    bVar1 = std::operator==(netrc_level,"OPTIONAL");
    if (bVar1) {
      local_30 = 1;
    }
    else {
      bVar1 = std::operator==(netrc_level,"REQUIRED");
      if (bVar1) {
        local_30 = 2;
      }
      else {
        bVar1 = std::operator==(netrc_level,"IGNORED");
        if (!bVar1) {
          std::__cxx11::string::operator=
                    ((string *)__return_storage_ptr__,
                     "NETRC accepts OPTIONAL, IGNORED or REQUIRED but got: ");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)netrc_level);
          return __return_storage_ptr__;
        }
        local_30 = 0;
      }
    }
  }
  if ((local_30 != 3) && (local_30 != 0)) {
    CVar3 = curl_easy_setopt((Curl_easy *)curl,CURLOPT_NETRC,(ulong)local_30);
    if ((CVar3 != CURLE_OK) && (CVar3 != CURLE_NOT_BUILT_IN)) {
      cVar2 = std::__cxx11::string::empty();
      pcVar6 = "\n";
      if (cVar2 != '\0') {
        pcVar6 = "";
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar6);
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,"Unable to set netrc level: ");
      pcVar6 = curl_easy_strerror(CVar3);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar6);
    }
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) != 0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
      uVar5 = std::__cxx11::string::c_str();
      CVar3 = curl_easy_setopt((Curl_easy *)curl,CURLOPT_NETRC_FILE,uVar5);
      if ((CVar3 != CURLE_OK) && (CVar3 != CURLE_NOT_BUILT_IN)) {
        cVar2 = std::__cxx11::string::empty();
        pcVar6 = "\n";
        if (cVar2 != '\0') {
          pcVar6 = "";
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar6);
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,"Unable to set .netrc file path : ");
        pcVar6 = curl_easy_strerror(CVar3);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar6);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCurlSetNETRCOption(::CURL* curl, const std::string& netrc_level,
                                 const std::string& netrc_file)
{
  std::string e;
  CURL_NETRC_OPTION curl_netrc_level = CURL_NETRC_LAST;
  ::CURLcode res;

  if (!netrc_level.empty()) {
    if (netrc_level == "OPTIONAL") {
      curl_netrc_level = CURL_NETRC_OPTIONAL;
    } else if (netrc_level == "REQUIRED") {
      curl_netrc_level = CURL_NETRC_REQUIRED;
    } else if (netrc_level == "IGNORED") {
      curl_netrc_level = CURL_NETRC_IGNORED;
    } else {
      e = "NETRC accepts OPTIONAL, IGNORED or REQUIRED but got: ";
      e += netrc_level;
      return e;
    }
  }

  if (curl_netrc_level != CURL_NETRC_LAST &&
      curl_netrc_level != CURL_NETRC_IGNORED) {
    res = ::curl_easy_setopt(curl, CURLOPT_NETRC, curl_netrc_level);
    check_curl_result(res, "Unable to set netrc level: ");
    if (!e.empty()) {
      return e;
    }

    // check to see if a .netrc file has been specified
    if (!netrc_file.empty()) {
      res = ::curl_easy_setopt(curl, CURLOPT_NETRC_FILE, netrc_file.c_str());
      check_curl_result(res, "Unable to set .netrc file path : ");
    }
  }
  return e;
}